

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void CtermCheck(chainEndData_t *ed,int rescnt,int isChainEnd)

{
  int local_1c;
  int i;
  int isChainEnd_local;
  int rescnt_local;
  chainEndData_t *ed_local;
  
  if ((isChainEnd != 0) && (rescnt != 0)) {
    ed->last = rescnt;
    for (local_1c = 0; (local_1c < 4 && (ed->ambigN[local_1c] != (atom *)0x0));
        local_1c = local_1c + 1) {
      if ((ed->ambigN[local_1c]->r->rescnt == ed->first) && (ed->Ntmarkers == ed->first)) {
        ed->ambigN[local_1c]->props = ed->ambigN[local_1c]->props | 0x400000;
      }
    }
    for (local_1c = 0; (local_1c < 8 && (ed->ambigO[local_1c] != (atom *)0x0));
        local_1c = local_1c + 1) {
      if ((ed->ambigO[local_1c]->r->rescnt == ed->last) && (ed->Ctmarkers == ed->last)) {
        ed->ambigO[local_1c]->props = ed->ambigO[local_1c]->props | 0x200000;
      }
    }
    initEndData(ed);
  }
  return;
}

Assistant:

void CtermCheck(chainEndData_t *ed, int rescnt, int isChainEnd)
{
   int i = 0;
   /* avoid processing the first time 'cause there ain't no chain pending */

   if (isChainEnd && rescnt) {
      ed->last = rescnt; /* last residue */

      /* see if we can put the pieces together to determine end charge */

      for (i = 0; i < 4; i++) { /* only array[0-3] contains first Ns */
	 if (ed->ambigN[i]) {
	    if (ed->ambigN[i]->r->rescnt == ed->first
	    &&  ed->Ntmarkers         == ed->first) {
	       ed->ambigN[i]->props |= POSITIVE_PROP;
	    }
	 }
	 else { break; }
      }
      for (i = 0; i < 8; i++) { /* array[0-7] contains last Os */
	 if (ed->ambigO[i]) {
	    if (ed->ambigO[i]->r->rescnt == ed->last
	    &&  ed->Ctmarkers         == ed->last) {
	       ed->ambigO[i]->props |= NEGATIVE_PROP;
	    }
	 }
	 else { break; }
      }

      initEndData(ed); /* reset the end data record */
   }
}